

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

aom_denoise_and_model_t *
aom_denoise_and_model_alloc(int bit_depth,int block_size,float noise_level)

{
  float *pfVar1;
  int in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  aom_denoise_and_model_t *ctx;
  aom_denoise_and_model_t *local_8;
  
  local_8 = (aom_denoise_and_model_t *)aom_malloc(0x3aa31c);
  if (local_8 == (aom_denoise_and_model_t *)0x0) {
    fprintf(_stderr,"Unable to allocate denoise_and_model struct\n");
    local_8 = (aom_denoise_and_model_t *)0x0;
  }
  else {
    memset(local_8,0,0x348);
    local_8->block_size = in_ESI;
    local_8->noise_level = in_XMM0_Da;
    local_8->bit_depth = in_EDI;
    pfVar1 = (float *)aom_malloc(0x3aa39e);
    local_8->noise_psd[0] = pfVar1;
    pfVar1 = (float *)aom_malloc(0x3aa3c1);
    local_8->noise_psd[1] = pfVar1;
    pfVar1 = (float *)aom_malloc(0x3aa3e4);
    local_8->noise_psd[2] = pfVar1;
    if (((local_8->noise_psd[0] == (float *)0x0) || (local_8->noise_psd[1] == (float *)0x0)) ||
       (local_8->noise_psd[2] == (float *)0x0)) {
      fprintf(_stderr,"Unable to allocate noise PSD buffers\n");
      aom_denoise_and_model_free(local_8);
      local_8 = (aom_denoise_and_model_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

struct aom_denoise_and_model_t *aom_denoise_and_model_alloc(int bit_depth,
                                                            int block_size,
                                                            float noise_level) {
  struct aom_denoise_and_model_t *ctx =
      (struct aom_denoise_and_model_t *)aom_malloc(
          sizeof(struct aom_denoise_and_model_t));
  if (!ctx) {
    fprintf(stderr, "Unable to allocate denoise_and_model struct\n");
    return NULL;
  }
  memset(ctx, 0, sizeof(*ctx));

  ctx->block_size = block_size;
  ctx->noise_level = noise_level;
  ctx->bit_depth = bit_depth;

  ctx->noise_psd[0] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[0]) * block_size * block_size);
  ctx->noise_psd[1] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[1]) * block_size * block_size);
  ctx->noise_psd[2] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[2]) * block_size * block_size);
  if (!ctx->noise_psd[0] || !ctx->noise_psd[1] || !ctx->noise_psd[2]) {
    fprintf(stderr, "Unable to allocate noise PSD buffers\n");
    aom_denoise_and_model_free(ctx);
    return NULL;
  }
  return ctx;
}